

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O0

LispPTR car(LispPTR datum)

{
  LispPTR *pLVar1;
  ConsCell *temp;
  ConsCell *datum68k;
  LispPTR datum_local;
  
  pLVar1 = NativeAligned4FromLAddr(datum);
  if ((*(ushort *)((ulong)(MDStypetbl + (datum >> 9)) ^ 2) & 0x7ff) == 5) {
    if (*pLVar1 >> 0x1c == 0) {
      pLVar1 = NativeAligned4FromLAddr(*pLVar1 & 0xfffffff);
      datum68k._4_4_ = *pLVar1 & 0xfffffff;
    }
    else {
      datum68k._4_4_ = *pLVar1 & 0xfffffff;
    }
  }
  else if (datum == 0) {
    datum68k._4_4_ = 0;
  }
  else if (datum == 0x4c) {
    datum68k._4_4_ = 0x4c;
  }
  else if ((datum & 0xfff0000) == 0) {
    datum68k._4_4_ = 0;
  }
  else {
    error("car : ARG not list");
    datum68k._4_4_ = 0;
  }
  return datum68k._4_4_;
}

Assistant:

LispPTR car(LispPTR datum)
/* datum must be LISP pointer(word offset) */
{
  ConsCell *datum68k;
  ConsCell *temp;

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(datum));
  if (Listp(datum)) {
    if (datum68k->cdr_code == CDR_INDIRECT) {
      temp = (ConsCell *)NativeAligned4FromLAddr(datum68k->car_field);
      return ((LispPTR)temp->car_field);
    } else
      return ((LispPTR)datum68k->car_field);
  }

  else if (datum == NIL_PTR)
    return ((LispPTR)NIL_PTR);

  else {
    if (datum == ATOM_T) return (ATOM_T);

    /** We assume CAR/CDRERR is CDR ***/
    else if ((datum & SEGMASK) == 0) /* LITATOM */
      return (NIL);
    else
      error("car : ARG not list");
    return (NIL); /* NOT REACHED */
  }
}